

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall capnp::LocalCallContext::~LocalCallContext(LocalCallContext *this)

{
  LocalCallContext *this_local;
  
  kj::Own<kj::PromiseFulfiller<void>_>::~Own(&this->cancelAllowedFulfiller);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>_>::~Maybe
            (&this->tailCallPipelineFulfiller);
  kj::Own<capnp::ClientHook>::~Own(&this->clientRef);
  kj::Maybe<capnp::Response<capnp::AnyPointer>_>::~Maybe(&this->response);
  kj::Maybe<kj::Own<capnp::MallocMessageBuilder>_>::~Maybe(&this->request);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class LocalCallContext final: public CallContextHook, public kj::Refcounted {
public:
  LocalCallContext(kj::Own<MallocMessageBuilder>&& request, kj::Own<ClientHook> clientRef,
                   kj::Own<kj::PromiseFulfiller<void>> cancelAllowedFulfiller)
      : request(kj::mv(request)), clientRef(kj::mv(clientRef)),
        cancelAllowedFulfiller(kj::mv(cancelAllowedFulfiller)) {}

  AnyPointer::Reader getParams() override {
    KJ_IF_MAYBE(r, request) {
      return r->get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }
  }
  void releaseParams() override {
    request = nullptr;
  }